

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_fill_random
              (mbedtls_mpi *X,size_t size,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t nblimbs;
  uchar *Xp;
  size_t overhead;
  size_t limbs;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t size_local;
  mbedtls_mpi *X_local;
  
  nblimbs = (size >> 3) + (long)(int)(uint)((size & 7) != 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    mbedtls_mpi_init(X);
    iVar1 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = mbedtls_mpi_lset(X,0);
  if (iVar1 == 0) {
    (*f_rng)(p_rng,(uchar *)((long)X->p + (nblimbs * 8 - size)),size);
    mpi_bigendian_to_host(X->p,nblimbs);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_fill_random( mbedtls_mpi *X, size_t size,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t const limbs = CHARS_TO_LIMBS( size );
    size_t const overhead = ( limbs * ciL ) - size;
    unsigned char *Xp;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    Xp = (unsigned char*) X->p;
    f_rng( p_rng, Xp + overhead, size );

    mpi_bigendian_to_host( X->p, limbs );

cleanup:
    return( ret );
}